

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

QStringList * __thiscall
QIconLoader::fallbackSearchPaths(QStringList *__return_storage_ptr__,QIconLoader *this)

{
  Data *pDVar1;
  qsizetype qVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  QArrayDataPointer<QString> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->m_fallbackDirs).d.size;
  if (lVar3 == 0) {
    if (QGuiApplicationPrivate::platform_theme == (QPlatformTheme *)0x0) {
      qVar2 = 0;
      uVar4 = 0;
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uStack_30 = 0xaaaaaaaa;
      uStack_2c = 0xaaaaaaaa;
      local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (*QGuiApplicationPrivate::platform_theme->_vptr_QPlatformTheme[0xc])
                (&local_48,QGuiApplicationPrivate::platform_theme,0x23);
      if (CONCAT44(uStack_2c,uStack_30) < 4) {
        ::QVariant::~QVariant((QVariant *)&local_48);
        qVar2 = 0;
        uVar4 = 0;
        uVar5 = 0;
        uVar6 = 0;
        uVar7 = 0;
      }
      else {
        ::QVariant::toStringList();
        ::QVariant::~QVariant((QVariant *)&local_48);
        qVar2 = local_68.size;
        uVar4 = local_68.d._0_4_;
        uVar5 = local_68.d._4_4_;
        uVar6 = local_68.ptr._0_4_;
        uVar7 = local_68.ptr._4_4_;
      }
    }
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    local_48.shared = (PrivateShared *)(this->m_fallbackDirs).d.d;
    local_48._8_8_ = (this->m_fallbackDirs).d.ptr;
    *(undefined4 *)&(this->m_fallbackDirs).d.d = uVar4;
    *(undefined4 *)((long)&(this->m_fallbackDirs).d.d + 4) = uVar5;
    *(undefined4 *)&(this->m_fallbackDirs).d.ptr = uVar6;
    *(undefined4 *)((long)&(this->m_fallbackDirs).d.ptr + 4) = uVar7;
    local_48._16_8_ = (this->m_fallbackDirs).d.size;
    (this->m_fallbackDirs).d.size = qVar2;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
    lVar3 = (this->m_fallbackDirs).d.size;
  }
  pDVar1 = (this->m_fallbackDirs).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->m_fallbackDirs).d.ptr;
  (__return_storage_ptr__->d).size = lVar3;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QIconLoader::fallbackSearchPaths() const
{
    if (m_fallbackDirs.isEmpty()) {
        m_fallbackDirs = systemFallbackSearchPaths();
    }
    return m_fallbackDirs;
}